

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli_parser.cpp
# Opt level: O3

bool __thiscall Fossilize::CLIParser::parse(CLIParser *this)

{
  _Manager_type p_Var1;
  char **ppcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__s;
  size_t sVar3;
  iterator iVar4;
  int iVar5;
  key_type local_50;
  
  iVar5 = this->argc;
  local_50._M_dataplus._M_p._0_1_ = 1;
  if (iVar5 != 0) {
    do {
      if (this->ended_state != false) break;
      p_Var1 = (this->cbs).default_handler.super__Function_base._M_manager;
      ppcVar2 = this->argv;
      this->argv = ppcVar2 + 1;
      __s = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*ppcVar2;
      this->argc = iVar5 + -1;
      if ((__s->_M_local_buf[0] == '-') || (p_Var1 == (_Manager_type)0x0)) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        sVar3 = strlen(__s->_M_local_buf);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,__s,__s->_M_local_buf + sVar3);
        iVar4 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        *)this,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (iVar4.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_true>
            ._M_cur == (__node_type *)0x0) {
          if (this->unknown_argument_is_default == true) {
            local_50._M_dataplus._M_p = (pointer)__s;
            if ((this->cbs).default_handler.super__Function_base._M_manager == (_Manager_type)0x0)
            goto LAB_00170ea1;
            goto LAB_00170e64;
          }
          parse();
          goto LAB_00170e7c;
        }
        if (*(long *)((long)iVar4.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_true>
                            ._M_cur + 0x38) == 0) {
LAB_00170ea1:
          std::__throw_bad_function_call();
        }
        (**(code **)((long)iVar4.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_true>
                           ._M_cur + 0x40))
                  ((long)iVar4.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_true>
                         ._M_cur + 0x28,this);
      }
      else {
LAB_00170e64:
        local_50._M_dataplus._M_p = (pointer)__s;
        (*(this->cbs).default_handler._M_invoker)
                  ((_Any_data *)&(this->cbs).default_handler,(char **)&local_50);
      }
      iVar5 = this->argc;
    } while (iVar5 != 0);
    local_50._M_dataplus._M_p._0_1_ = 1;
  }
LAB_00170e7c:
  return (bool)((byte)local_50._M_dataplus._M_p & 1);
}

Assistant:

bool CLIParser::parse()
{
	while (argc && !ended_state)
	{
		const char *next = *argv++;
		argc--;

		if (*next != '-' && cbs.default_handler)
		{
			cbs.default_handler(next);
		}
		else
		{
			auto itr = cbs.callbacks.find(next);
			if (itr == ::end(cbs.callbacks))
			{
				if (unknown_argument_is_default)
					cbs.default_handler(next);
				else
				{
					LOGE("Invalid argument.\n");
					if (cbs.error_handler)
						cbs.error_handler();
					return false;
				}
			}
			else
				itr->second(*this);
		}
	}

	return true;
}